

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O3

void __thiscall pstack::Dwarf::Unit::load(Unit *this)

{
  Object *this_00;
  int iVar1;
  undefined4 extraout_var;
  pointer pcVar2;
  undefined1 auVar3 [16];
  long local_80;
  uintmax_t code;
  undefined8 *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [40];
  
  this_00 = (this->dwarf->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,".debug_abbrev","");
  Elf::Object::getDebugSection(this_00,(string *)local_58,0);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  Elf::Section::io((Section *)local_68);
  pcVar2 = (pointer)this->abbrevOffset;
  local_58._0_8_ = pcVar2;
  iVar1 = (*(*(_func_int ***)local_68._0_8_)[8])();
  local_58._8_8_ = CONCAT44(extraout_var,iVar1);
  local_58._16_8_ = local_68._0_8_;
  local_58._24_8_ = local_68._8_8_;
  local_68._0_8_ = (element_type *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._32_4_ = 8;
  while( true ) {
    auVar3 = (**(code **)(*(long *)local_58._16_8_ + 0x18))(local_58._16_8_,pcVar2);
    local_80 = auVar3._0_8_;
    local_58._0_8_ = local_58._0_8_ + auVar3._8_8_;
    if (local_80 == 0) break;
    code = (uintmax_t)&local_80;
    local_70 = (undefined8 *)local_58;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<pstack::Dwarf::DWARFReader&>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->abbreviations,&std::piecewise_construct,&code,&local_70);
    pcVar2 = (pointer)local_58._0_8_;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_);
  }
  return;
}

Assistant:

void
Unit::load()
{
    auto &abbrev { dwarf->elf->getDebugSection(".debug_abbrev", SHT_NULL) };
    DWARFReader abbR(abbrev.io(), abbrevOffset);
    uintmax_t code;
    while ((code = abbR.getuleb128()) != 0)
        abbreviations.emplace(std::piecewise_construct,
                std::forward_as_tuple(code),
                std::forward_as_tuple(abbR));
}